

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

void vkt::texture::util::calcTexelGridCoordRange
               (Vec3 *unnormalizedCoordMin,Vec3 *unnormalizedCoordMax,int coordBits,
               IVec3 *gridCoordMin,IVec3 *gridCoordMax)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  double *__iptr;
  int compNdx;
  long lVar5;
  int ndx;
  long lVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  float fracPart [2];
  float comp [2];
  double intPart [2];
  
  bVar3 = (byte)coordBits;
  iVar4 = 1 << (bVar3 & 0x1f);
  fVar7 = (float)iVar4;
  iVar4 = iVar4 + -1;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    comp[0] = unnormalizedCoordMin->m_data[lVar5];
    comp[1] = unnormalizedCoordMax->m_data[lVar5];
    __iptr = intPart;
    for (lVar6 = 0; dVar9 = intPart[1], lVar6 != 2; lVar6 = lVar6 + 1) {
      fVar8 = comp[lVar6];
      dVar9 = modf((double)fVar8,__iptr);
      fracPart[lVar6] = (float)dVar9;
      if (fVar8 < 0.0) {
        *__iptr = *__iptr + -1.0;
        fracPart[lVar6] = (float)dVar9 + 1.0;
      }
      __iptr = __iptr + 1;
    }
    dVar10 = floor(intPart[0]);
    dVar9 = floor(dVar9);
    fVar8 = floorf(fracPart[0] * fVar7);
    iVar1 = (int)fVar8;
    if ((int)fVar8 < 1) {
      iVar1 = 0;
    }
    fVar8 = ceilf(fracPart[1] * fVar7);
    iVar2 = (int)fVar8;
    if (iVar4 <= (int)fVar8) {
      iVar2 = iVar4;
    }
    gridCoordMin->m_data[lVar5] = ((int)dVar10 << (bVar3 & 0x1f)) + iVar1;
    gridCoordMax->m_data[lVar5] = ((int)dVar9 << (bVar3 & 0x1f)) + iVar2;
  }
  return;
}

Assistant:

void calcTexelGridCoordRange (const Vec3&	unnormalizedCoordMin,
							  const Vec3&	unnormalizedCoordMax,
							  const int		coordBits,
							  IVec3&		gridCoordMin,
							  IVec3&		gridCoordMax)
{
	const int subdivisions = 1 << coordBits;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const float comp[2] = {unnormalizedCoordMin[compNdx],
							   unnormalizedCoordMax[compNdx]};

		float	fracPart[2];
		double	intPart[2];

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			fracPart[ndx] = (float) deModf(comp[ndx], &intPart[ndx]);

			if (comp[ndx] < 0.0f)
			{
				intPart [ndx] -= 1.0;
				fracPart[ndx] += 1.0f;
			}
		}

		const deInt32	nearestTexelGridOffsetMin = (deInt32) deFloor(intPart[0]);
		const deInt32	nearestTexelGridOffsetMax = (deInt32) deFloor(intPart[1]);

		const deInt32	subTexelGridCoordMin	  = de::max((deInt32) deFloor(fracPart[0] * (float) subdivisions), (deInt32) 0);
		const deInt32	subTexelGridCoordMax	  = de::min((deInt32) deCeil (fracPart[1] * (float) subdivisions), (deInt32) (subdivisions - 1));

	    gridCoordMin[compNdx] = nearestTexelGridOffsetMin * (deInt32) subdivisions + subTexelGridCoordMin;
	    gridCoordMax[compNdx] = nearestTexelGridOffsetMax * (deInt32) subdivisions + subTexelGridCoordMax;
	}
}